

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O3

int cram_index_load(cram_fd *fd,char *fn)

{
  char *pcVar1;
  byte *pbVar2;
  char cVar3;
  cram_fd *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined8 *__ptr;
  hFILE *fp;
  kstring_t *pkVar9;
  size_t *psVar10;
  cram_index *pcVar11;
  undefined8 *puVar12;
  int iVar13;
  cram_index *pcVar14;
  ssize_t sVar15;
  size_t sVar16;
  kstring_t *k;
  long lVar17;
  ulong uVar18;
  kstring_t *pkVar19;
  size_t l;
  char fn2 [4096];
  char buf [65536];
  size_t *psStack_110b8;
  kstring_t *pkStack_110a8;
  cram_index *pcStack_110a0;
  kstring_t *pkStack_11098;
  undefined8 uStack_11090;
  int iStack_11088;
  int iStack_11084;
  int iStack_11080;
  undefined4 uStack_1107c;
  undefined8 uStack_11078;
  long lStack_11070;
  kstring_t kStack_11068;
  long lStack_11048;
  cram_fd *pcStack_11040;
  char acStack_11038 [4096];
  undefined1 auStack_10038 [65544];
  
  kStack_11068.s = (char *)0x0;
  kStack_11068.l = 0;
  kStack_11068.m = 0;
  pkStack_110a8 = (kstring_t *)0x0;
  if (fd->index != (cram_index *)0x0) {
    return 0;
  }
  fd->index_sz = 1;
  pcStack_110a0 = (cram_index *)calloc(1,0x30);
  fd->index = pcStack_110a0;
  if (pcStack_110a0 == (cram_index *)0x0) {
    return -1;
  }
  pcStack_110a0->refid = -1;
  pcStack_110a0->start = -0x80000000;
  pcStack_110a0->end = 0x7fffffff;
  __ptr = (undefined8 *)calloc(1,8);
  *__ptr = pcStack_110a0;
  sprintf(acStack_11038,"%s.crai",fn);
  fp = hopen(acStack_11038,"r");
  if (fp == (hFILE *)0x0) {
    perror(acStack_11038);
  }
  else {
    uVar18 = (long)fp->end - (long)fp->begin;
    sVar15 = 0x10000;
    sVar16 = 0x10000;
    if (uVar18 < 0x10000) {
      sVar16 = uVar18;
    }
    memcpy(auStack_10038,fp->begin,sVar16);
    fp->begin = fp->begin + sVar16;
    if ((0xffff < uVar18) || (sVar15 = hread2(fp,auStack_10038,0x10000,sVar16), 0 < sVar15)) {
      psStack_110b8 = (size_t *)0x0;
      pkVar19 = (kstring_t *)0x0;
      k = (kstring_t *)0x0;
      pcStack_11040 = fd;
      do {
        sVar16 = (size_t)(int)sVar15;
        pkVar9 = (kstring_t *)((long)&k->l + sVar16 + 1);
        psVar10 = psStack_110b8;
        if (pkVar9 < pkVar19) {
LAB_001297f8:
          pcVar1 = (char *)((long)psVar10 + (long)k);
          k = (kstring_t *)((long)&k->l + sVar16);
          memcpy(pcVar1,auStack_10038,sVar16);
          *(char *)((long)psVar10 + (long)k) = '\0';
          psStack_110b8 = psVar10;
        }
        else {
          uVar18 = (ulong)pkVar9 >> 1 | (ulong)pkVar9;
          uVar18 = uVar18 >> 2 | uVar18;
          uVar18 = uVar18 >> 4 | uVar18;
          uVar18 = uVar18 >> 8 | uVar18;
          pkVar19 = (kstring_t *)((uVar18 >> 0x10 | uVar18) + 1);
          psVar10 = (size_t *)realloc(psStack_110b8,(size_t)pkVar19);
          if (psVar10 != (size_t *)0x0) goto LAB_001297f8;
        }
        uVar18 = (long)fp->end - (long)fp->begin;
        sVar15 = 0x10000;
        sVar16 = 0x10000;
        if (uVar18 < 0x10000) {
          sVar16 = uVar18;
        }
        memcpy(auStack_10038,fp->begin,sVar16);
        fp->begin = fp->begin + sVar16;
        if (uVar18 < 0x10000) {
          sVar15 = hread2(fp,auStack_10038,0x10000,sVar16);
        }
      } while (0 < sVar15);
      kStack_11068.s = (char *)psStack_110b8;
      kStack_11068.l = (size_t)k;
      kStack_11068.m = (size_t)pkVar19;
      if (((sVar15 == 0) && ((kstring_t *)0x1 < k)) &&
         (iVar5 = hclose(fp), pcVar11 = pcStack_110a0, iVar5 == 0)) {
        if (((char)*psStack_110b8 == '\x1f') && (*(char *)((long)psStack_110b8 + 1) == -0x75)) {
          psVar10 = (size_t *)
                    zlib_mem_inflate((char *)psStack_110b8,(size_t)k,(size_t *)&pkStack_11098);
          free(psStack_110b8);
          if (psVar10 == (size_t *)0x0) goto LAB_001298c3;
          kStack_11068.l = (size_t)pkStack_11098;
          kStack_11068.m = (size_t)pkStack_11098;
          kStack_11068.s = (char *)psVar10;
          kputsn("",0,&kStack_11068);
          k = (kstring_t *)kStack_11068.l;
        }
        iVar5 = 0;
        psStack_110b8._0_4_ = 1;
        while( true ) {
          pcVar1 = kStack_11068.s;
          pcStack_110a0 = pcVar11;
          iVar6 = kget_int32(k,(size_t *)kStack_11068.s,(int32_t *)&pkStack_110a8);
          if (((iVar6 == -1) ||
              (iVar6 = kget_int32(k,(size_t *)pcVar1,(int32_t *)&pkStack_110a8), iVar6 == -1)) ||
             (iVar6 = kget_int32(k,(size_t *)pcVar1,(int32_t *)&pkStack_110a8), iVar6 == -1)) break;
          uVar18 = 1;
          pkVar19 = pkStack_110a8;
          if (pkStack_110a8 < k) {
            while ((cVar3 = *(char *)((long)pcVar1 + (long)pkVar19), cVar3 == ' ' || (cVar3 == '\t')
                   )) {
              pkVar19 = (kstring_t *)((long)&pkVar19->l + 1);
              if (k == pkVar19) goto LAB_00129cb4;
            }
            pkVar19 = (kstring_t *)((long)&pkVar19->l + (ulong)(cVar3 == '-'));
            uVar18 = -(ulong)(cVar3 == '-') | 1;
          }
          if ((k <= pkVar19) || (9 < (byte)(*(char *)((long)pcVar1 + (long)pkVar19) - 0x30U)))
          break;
          lStack_11070 = 0;
          do {
            pbVar2 = (byte *)((long)pcVar1 + (long)pkVar19);
            pkStack_110a8 = pkVar19;
            if (9 < (byte)(*pbVar2 - 0x30)) break;
            pkVar19 = (kstring_t *)((long)&pkVar19->l + 1);
            lStack_11070 = (ulong)*pbVar2 + lStack_11070 * 10 + -0x30;
            pkStack_110a8 = k;
          } while (k != pkVar19);
          lStack_11070 = lStack_11070 * uVar18;
          iVar6 = kget_int32(k,(size_t *)pcVar1,(int32_t *)&pkStack_110a8);
          if ((iVar6 == -1) ||
             (iVar7 = kget_int32(k,(size_t *)pcVar1,(int32_t *)&pkStack_110a8),
             pcVar4 = pcStack_11040, iVar13 = iStack_11084, iVar6 = iStack_11088, iVar7 == -1))
          break;
          iVar7 = iStack_11084 + iStack_11080 + -1;
          lVar17 = (long)iStack_11088;
          iStack_11080 = iVar7;
          if (lVar17 < -1) {
            cram_index_load_cold_1();
            return -1;
          }
          pcVar14 = pcStack_110a0;
          if (iStack_11088 != pcStack_110a0->refid) {
            iVar5 = pcStack_11040->index_sz;
            uVar8 = iStack_11088 + 2;
            pcVar11 = pcStack_11040->index;
            if (iVar5 < (int)uVar8) {
              pcStack_110a0 = (cram_index *)((long)iVar5 * 0x30);
              pcStack_11040->index_sz = uVar8;
              lStack_11048 = (long)iVar5;
              pcVar11 = (cram_index *)realloc(pcVar11,(ulong)uVar8 * 0x30);
              pcVar4->index = pcVar11;
              memset((void *)((long)&pcVar11->nslice + (long)&pcStack_110a0->nslice),0,
                     (pcVar4->index_sz - lStack_11048) * 0x30);
            }
            pcVar14 = pcVar11 + lVar17 + 1;
            pcVar11[lVar17 + 1].refid = iVar6;
            pcVar11[lVar17 + 1].start = -0x80000000;
            pcVar11[lVar17 + 1].end = 0x7fffffff;
            pcVar14->nslice = 0;
            pcVar14->nalloc = 0;
            pcVar11[lVar17 + 1].e = (cram_index *)0x0;
            *__ptr = pcVar14;
            iVar5 = 0;
          }
          lVar17 = (long)iVar5;
          iVar5 = iVar5 + 1;
          puVar12 = __ptr + lVar17;
          while ((puVar12 = puVar12 + -1, iVar13 < pcVar14->start || (pcVar14->end < iVar7))) {
            iVar5 = iVar5 + -1;
            pcVar14 = (cram_index *)*puVar12;
          }
          iVar6 = pcVar14->nalloc;
          if (iVar6 <= pcVar14->nslice + 1) {
            iVar13 = iVar6 * 2;
            if (iVar6 == 0) {
              iVar13 = 0x10;
            }
            pcVar14->nalloc = iVar13;
            pcVar11 = (cram_index *)realloc(pcVar14->e,(long)iVar13 * 0x30);
            pcVar14->e = pcVar11;
          }
          pkStack_11098 = (kstring_t *)0x0;
          uStack_11090 = 0;
          pcVar11 = pcVar14->e;
          iVar6 = pcVar14->nslice;
          pcVar14->nslice = iVar6 + 1;
          pcVar14 = pcVar11 + iVar6;
          pcVar14->slice = (undefined4)uStack_11078;
          pcVar14->len = uStack_11078._4_4_;
          *(long *)(&pcVar14->slice + 2) = lStack_11070;
          pcVar14 = pcVar11 + iVar6;
          pcVar14->refid = iStack_11088;
          pcVar14->start = iStack_11084;
          *(ulong *)(&pcVar14->refid + 2) = CONCAT44(uStack_1107c,iStack_11080);
          pcVar14 = pcVar11 + iVar6;
          pcVar14->nslice = 0;
          pcVar14->nalloc = 0;
          pcVar14->e = (cram_index *)0x0;
          if ((int)psStack_110b8 <= iVar5) {
            psStack_110b8._0_4_ = (int)psStack_110b8 * 2;
            __ptr = (undefined8 *)realloc(__ptr,(long)(int)psStack_110b8 << 3);
            k = (kstring_t *)kStack_11068.l;
          }
          pcVar11 = pcVar11 + iVar6;
          __ptr[iVar5] = pcVar11;
          pkVar19 = pkStack_110a8;
          if (pkStack_110a8 < k) {
            do {
              pkVar19 = pkStack_110a8;
              if (*(char *)((long)kStack_11068.s + (long)pkStack_110a8) == '\n') break;
              pkStack_110a8 = (kstring_t *)((long)&pkStack_110a8->l + 1);
              pkVar19 = k;
            } while (k != pkStack_110a8);
          }
          pkStack_110a8 = (kstring_t *)((long)&pkVar19->l + 1);
          if (k <= pkStack_110a8) {
            free(__ptr);
            free(kStack_11068.s);
            return 0;
          }
        }
LAB_00129cb4:
        free(pcVar1);
      }
      else if (psStack_110b8 != (size_t *)0x0) {
        free(psStack_110b8);
      }
    }
  }
LAB_001298c3:
  free(__ptr);
  return -1;
}

Assistant:

int cram_index_load(cram_fd *fd, const char *fn) {
    char fn2[PATH_MAX];
    char buf[65536];
    ssize_t len;
    kstring_t kstr = {0};
    hFILE *fp;
    cram_index *idx;
    cram_index **idx_stack = NULL, *ep, e;
    int idx_stack_alloc = 0, idx_stack_ptr = 0;
    size_t pos = 0;

    /* Check if already loaded */
    if (fd->index)
	return 0;

    fd->index = calloc((fd->index_sz = 1), sizeof(*fd->index));
    if (!fd->index)
	return -1;

    idx = &fd->index[0];
    idx->refid = -1;
    idx->start = INT_MIN;
    idx->end   = INT_MAX;

    idx_stack = calloc(++idx_stack_alloc, sizeof(*idx_stack));
    idx_stack[idx_stack_ptr] = idx;

    sprintf(fn2, "%s.crai", fn);
    if (!(fp = hopen(fn2, "r"))) {
	perror(fn2);
	free(idx_stack);
	return -1; 
    }

    // Load the file into memory
    while ((len = hread(fp, buf, 65536)) > 0)
	kputsn(buf, len, &kstr);
    if (len < 0 || kstr.l < 2) {
	if (kstr.s)
	    free(kstr.s);
	free(idx_stack);
	return -1;
    }

    if (hclose(fp)) {
	if (kstr.s)
	    free(kstr.s);
	free(idx_stack);
	return -1;
    }
	

    // Uncompress if required
    if (kstr.s[0] == 31 && (uc)kstr.s[1] == 139) {
	size_t l;
	char *s = zlib_mem_inflate(kstr.s, kstr.l, &l);
	free(kstr.s);
	if (!s) {
	    free(idx_stack);
	    return -1;
	}
	kstr.s = s;
	kstr.l = l;
	kstr.m = l; // conservative estimate of the size allocated
	kputsn("", 0, &kstr); // ensure kstr.s is NUL-terminated
    }


    // Parse it line at a time
    do {
	/* 1.1 layout */
	if (kget_int32(&kstr, &pos, &e.refid) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.start) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.end) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int64(&kstr, &pos, &e.offset) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.slice) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.len) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}

	e.end += e.start-1;
	//printf("%d/%d..%d\n", e.refid, e.start, e.end);

	if (e.refid < -1) {
	    free(kstr.s);
	    free(idx_stack);
	    fprintf(stderr, "Malformed index file, refid %d\n", e.refid);
	    return -1;
	}

	if (e.refid != idx->refid) {
	    if (fd->index_sz < e.refid+2) {
		size_t index_end = fd->index_sz * sizeof(*fd->index);
		fd->index_sz = e.refid+2;
		fd->index = realloc(fd->index,
				    fd->index_sz * sizeof(*fd->index));
		memset(((char *)fd->index) + index_end, 0,
		       fd->index_sz * sizeof(*fd->index) - index_end);
	    }
	    idx = &fd->index[e.refid+1];
	    idx->refid = e.refid;
	    idx->start = INT_MIN;
	    idx->end   = INT_MAX;
	    idx->nslice = idx->nalloc = 0;
	    idx->e = NULL;
	    idx_stack[(idx_stack_ptr = 0)] = idx;
	}

	while (!(e.start >= idx->start && e.end <= idx->end)) {
	    idx = idx_stack[--idx_stack_ptr];
	}

	// Now contains, so append
	if (idx->nslice+1 >= idx->nalloc) {
	    idx->nalloc = idx->nalloc ? idx->nalloc*2 : 16;
	    idx->e = realloc(idx->e, idx->nalloc * sizeof(*idx->e));
	}

	e.nalloc = e.nslice = 0; e.e = NULL;
	*(ep = &idx->e[idx->nslice++]) = e;
	idx = ep;

	if (++idx_stack_ptr >= idx_stack_alloc) {
	    idx_stack_alloc *= 2;
	    idx_stack = realloc(idx_stack, idx_stack_alloc*sizeof(*idx_stack));
	}
	idx_stack[idx_stack_ptr] = idx;

	while (pos < kstr.l && kstr.s[pos] != '\n')
	    pos++;
	pos++;
    } while (pos < kstr.l);

    free(idx_stack);
    free(kstr.s);

    // dump_index(fd);

    return 0;
}